

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DaTrie<true,_false,_false>::xcheck_
          (DaTrie<true,_false,_false> *this,Edge *edge,uint32_t ng_block,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  uint uVar2;
  byte *pbVar3;
  const_reference pvVar4;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RCX;
  uint in_EDX;
  Edge *in_RSI;
  Edge *in_RDI;
  uint32_t base;
  uint32_t block_pos;
  uint local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  Edge *edge_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RDI->labels_ + 0x60) == -1) {
    uVar1 = bc_size((DaTrie<true,_false,_false> *)0x163b11);
    pbVar3 = Edge::begin(in_RSI);
    uVar2 = uVar1 ^ *pbVar3;
  }
  else {
    local_2c = *(uint *)(in_RDI->labels_ + 0x60);
    edge_00 = in_RDI;
    do {
      if ((local_2c != in_EDX) &&
         (uVar1 = xcheck_in_block_((DaTrie<true,_false,_false> *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   edge_00,(uint32_t)((ulong)in_RSI >> 0x20),
                                   (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)
                                   CONCAT44(in_EDX,in_stack_ffffffffffffffe0)), uVar1 != 0xffffffff)
         ) {
        return uVar1;
      }
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RCX,(ulong)local_2c);
      local_2c = pvVar4->next;
    } while (local_2c != *(uint32_t *)(in_RDI->labels_ + 0x60));
    uVar1 = bc_size((DaTrie<true,_false,_false> *)0x163ba5);
    pbVar3 = Edge::begin(in_RSI);
    uVar2 = uVar1 ^ *pbVar3;
  }
  return uVar2;
}

Assistant:

uint32_t xcheck_(const Edge& edge, const uint32_t ng_block,
                   const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (head_pos_ == NOT_FOUND) {
      return bc_size() ^ *edge.begin();
    }

    auto block_pos = head_pos_;
    do {
      if (block_pos == ng_block) {
        continue;
      }
      auto base = xcheck_in_block_(edge, block_pos, blocks);
      if (base != NOT_FOUND) {
        return base;
      }
    } while ((block_pos = blocks[block_pos].next) != head_pos_);

    return bc_size() ^ *edge.begin();
  }